

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<absl::lts_20240722::Cord>::InternalDeallocate<true>
          (RepeatedField<absl::lts_20240722::Cord> *this)

{
  int iVar1;
  HeapRep *pHVar2;
  LongSooRep *this_00;
  long *plVar3;
  long lStack_38;
  code *pcStack_30;
  LongSooRep local_20;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
    pcStack_30 = (code *)0x25656e;
    pHVar2 = heap_rep(this);
    if ((pHVar2->field_0).arena != (Arena *)0x0) {
      return;
    }
    pcStack_30 = (code *)0x25658c;
    pHVar2 = heap_rep(this);
    operator_delete(pHVar2,(long)iVar1 * 0x10 + 0x10);
    return;
  }
  this_00 = &local_20;
  pcStack_30 = heap_rep;
  InternalDeallocate<true>((RepeatedField<absl::lts_20240722::Cord> *)this_00);
  if ((this_00->elements_int & 4) != 0) {
    internal::LongSooRep::elements(this_00);
    return;
  }
  plVar3 = &lStack_38;
  heap_rep();
  if (*plVar3 != 1) {
    if (*plVar3 != 0) {
      return;
    }
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  __assert_fail("!is_soo()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf74,
                "ctrl_t *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::control() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
               );
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }